

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)60,_(unsigned_short)22>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  puVar2 = *in;
  uVar1 = *puVar2;
  out[0x16] = (ulong)(uVar1 >> 8);
  *in = puVar2 + 1;
  uVar3 = (ulong)puVar2[1] << 0x18 | (ulong)(uVar1 >> 8);
  out[0x16] = uVar3;
  *in = puVar2 + 2;
  out[0x16] = (ulong)(puVar2[2] & 0xf) << 0x38 | uVar3;
  Unroller<(unsigned_short)60,_(unsigned_short)23>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}